

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O0

IWorker * xmrig::Workers<xmrig::CpuLaunchData>::create(Thread<xmrig::CpuLaunchData> *handle)

{
  CpuLaunchData *pCVar1;
  CpuWorker<3UL> *this;
  Thread<xmrig::CpuLaunchData> *in_RDI;
  CpuLaunchData *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  CpuWorker<5UL> *in_stack_ffffffffffffffa0;
  IWorker *local_8;
  
  pCVar1 = Thread<xmrig::CpuLaunchData>::config(in_RDI);
  switch(pCVar1->intensity) {
  case 1:
    local_8 = (IWorker *)operator_new(0x3b0);
    Thread<xmrig::CpuLaunchData>::id(in_RDI);
    Thread<xmrig::CpuLaunchData>::config(in_RDI);
    CpuWorker<1UL>::CpuWorker
              ((CpuWorker<1UL> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90);
    break;
  case 2:
    local_8 = (IWorker *)operator_new(0x4e0);
    Thread<xmrig::CpuLaunchData>::id(in_RDI);
    Thread<xmrig::CpuLaunchData>::config(in_RDI);
    CpuWorker<2UL>::CpuWorker
              ((CpuWorker<2UL> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90);
    break;
  case 3:
    local_8 = (IWorker *)operator_new(0x600);
    this = (CpuWorker<3UL> *)Thread<xmrig::CpuLaunchData>::id(in_RDI);
    pCVar1 = Thread<xmrig::CpuLaunchData>::config(in_RDI);
    CpuWorker<3UL>::CpuWorker(this,(size_t)local_8,pCVar1);
    break;
  case 4:
    local_8 = (IWorker *)operator_new(0x730);
    Thread<xmrig::CpuLaunchData>::id(in_RDI);
    Thread<xmrig::CpuLaunchData>::config(in_RDI);
    CpuWorker<4UL>::CpuWorker
              ((CpuWorker<4UL> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90);
    break;
  case 5:
    local_8 = (IWorker *)operator_new(0x850);
    Thread<xmrig::CpuLaunchData>::id(in_RDI);
    Thread<xmrig::CpuLaunchData>::config(in_RDI);
    CpuWorker<5UL>::CpuWorker
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    break;
  default:
    local_8 = (IWorker *)0x0;
  }
  return local_8;
}

Assistant:

xmrig::IWorker *xmrig::Workers<CpuLaunchData>::create(Thread<CpuLaunchData> *handle)
{
    switch (handle->config().intensity) {
    case 1:
        return new CpuWorker<1>(handle->id(), handle->config());

    case 2:
        return new CpuWorker<2>(handle->id(), handle->config());

    case 3:
        return new CpuWorker<3>(handle->id(), handle->config());

    case 4:
        return new CpuWorker<4>(handle->id(), handle->config());

    case 5:
        return new CpuWorker<5>(handle->id(), handle->config());
    }

    return nullptr;
}